

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_serial_impl_deserialize.c
# Opt level: O0

int metacall_serial_impl_deserialize_char(value *v,char *src,size_t length)

{
  long lVar1;
  char *in_RSI;
  long *in_RDI;
  long l;
  uint local_4;
  
  if ((*in_RSI == '0') && (in_RSI[1] == 'x')) {
    lVar1 = strtol(in_RSI,(char **)0x0,0x10);
    if ((lVar1 < 0) || (0xff < lVar1)) {
      local_4 = 1;
    }
    else {
      lVar1 = value_create_char((int)(char)lVar1);
      *in_RDI = lVar1;
      local_4 = (uint)(*in_RDI == 0);
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int metacall_serial_impl_deserialize_char(value *v, const char *src, size_t length)
{
	long l = 0;

	(void)length;

	if (src[0] != '0' || src[1] != 'x')
	{
		return 1;
	}

	l = strtol(src, NULL, 16);

	if (l < 0 || l > 255)
	{
		return 1;
	}

	*v = value_create_char((char)(l & 0xFF));

	return (*v == NULL);
}